

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_ManMarkNodesGia(Bac_Man_t *p,Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_28;
  int local_24;
  int Count;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia_local;
  Bac_Man_t *p_local;
  
  local_28 = 0;
  iVar1 = Vec_IntSize(&p->vBuf2LeafNtk);
  iVar2 = Gia_ManBufNum(pGia);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x118,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  pGVar4 = Gia_ManConst0(pGia);
  pGVar4->Value = 1;
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(pGia);
    bVar5 = false;
    if (local_24 < iVar1) {
      _Count = Gia_ManCi(pGia,local_24);
      bVar5 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    _Count->Value = 1;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar5 = false;
    if (local_24 < pGia->nObjs) {
      _Count = Gia_ManObj(pGia,local_24);
      bVar5 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_Count);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsBuf(_Count);
      if (iVar1 == 0) {
        pGVar4 = Gia_ObjFanin0(_Count);
        _Count->Value = pGVar4->Value;
        uVar3 = _Count->Value;
        pGVar4 = Gia_ObjFanin1(_Count);
        if (uVar3 != pGVar4->Value) {
          __assert_fail("pObj->Value == Gia_ObjFanin1(pObj)->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,0x123,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
        }
      }
      else {
        uVar3 = Vec_IntEntry(&p->vBuf2LeafNtk,local_28);
        _Count->Value = uVar3;
        local_28 = local_28 + 1;
      }
    }
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManBufNum(pGia);
  if (local_28 != iVar1) {
    __assert_fail("Count == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x126,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pGia);
    bVar5 = false;
    if (local_24 < iVar1) {
      _Count = Gia_ManCo(pGia,local_24);
      bVar5 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pGVar4 = Gia_ObjFanin0(_Count);
    if (pGVar4->Value != 1) {
      __assert_fail("Gia_ObjFanin0(pObj)->Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                    ,0x129,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
    }
    _Count->Value = 1;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Bac_ManMarkNodesGia( Bac_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj; int i, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia) );
    Gia_ManConst0(pGia)->Value = 1;
    Gia_ManForEachPi( pGia, pObj, i )
        pObj->Value = 1;
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else
        {
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value == Gia_ObjFanin1(pObj)->Value );
        }
    }
    assert( Count == Gia_ManBufNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
    {
        assert( Gia_ObjFanin0(pObj)->Value == 1 );
        pObj->Value = 1;
    }
}